

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

void Abc_NtkRetimeMinAreaPrepare(Abc_Ntk_t *pNtk,int fForward)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  void *pvVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fForward_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fForward == 0) {
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_34);
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_34);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
        pAVar2 = Abc_ObjFanout0(pAVar2);
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
      }
    }
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,local_34);
      Abc_NtkMarkCone_rec(pAVar2,0);
    }
  }
  else {
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,local_34);
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_34);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
        pAVar2 = Abc_ObjFanin0(pAVar2);
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
      }
    }
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_34);
      Abc_NtkMarkCone_rec(pAVar2,fForward);
    }
    p = Vec_PtrAlloc(100);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) != 0)) {
        for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_38 < iVar1;
            local_38 = local_38 + 1) {
          Entry = Abc_ObjFanin(pAVar2,local_38);
          if ((*(uint *)&Entry->field_0x14 >> 4 & 1) == 0) {
            Vec_PtrPush(p,Entry);
          }
        }
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar3 = Vec_PtrEntry(p,local_34);
      *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffef | 0x10;
    }
    Vec_PtrFree(p);
  }
  return;
}

Assistant:

void Abc_NtkRetimeMinAreaPrepare( Abc_Ntk_t * pNtk, int fForward )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( fForward )
    {
        // mark the frontier
        Abc_NtkForEachPo( pNtk, pObj, i )
            pObj->fMarkA = 1;
        Abc_NtkForEachLatch( pNtk, pObj, i )
        {
            pObj->fMarkA = 1;
            Abc_ObjFanin0(pObj)->fMarkA = 1;
        }
        // mark the nodes reachable from the PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            Abc_NtkMarkCone_rec( pObj, fForward );
        // collect the unmarked fanins of the marked nodes
        vNodes = Vec_PtrAlloc( 100 );
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( pObj->fMarkA )
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    if ( !pFanin->fMarkA )
                        Vec_PtrPush( vNodes, pFanin );
        // mark these nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            pObj->fMarkA = 1;
        Vec_PtrFree( vNodes );
    }
    else
    {
        // mark the frontier
        Abc_NtkForEachPi( pNtk, pObj, i )
            pObj->fMarkA = 1;
        Abc_NtkForEachLatch( pNtk, pObj, i )
        {
            pObj->fMarkA = 1;
            Abc_ObjFanout0(pObj)->fMarkA = 1;
        }
        // mark the nodes reachable from the POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            Abc_NtkMarkCone_rec( pObj, fForward );
    }
}